

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O3

void __thiscall Potassco::TheoryData::update(TheoryData *this)

{
  Data *pDVar1;
  ulong uVar2;
  
  pDVar1 = this->data_;
  uVar2 = (pDVar1->elems).top;
  (pDVar1->frame).atom = (uint32_t)((pDVar1->atoms).top >> 3);
  (pDVar1->frame).term = (uint32_t)((pDVar1->terms).top >> 3);
  (pDVar1->frame).elem = (uint32_t)(uVar2 >> 3);
  return;
}

Assistant:

uint32_t TheoryData::numAtoms() const {
	return data_->atoms.size();
}